

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O0

void __thiscall QFileSystemComboBox::setRootPath(QFileSystemComboBox *this,QString *rootPath)

{
  QString *in_RSI;
  long in_RDI;
  LayoutValue *lv;
  QFileSystemComboBoxPrivate *this_00;
  
  lv = *(LayoutValue **)(in_RDI + 0x28);
  this_00 = (QFileSystemComboBoxPrivate *)&stack0xffffffffffffffd8;
  std::optional<std::pair<int,_QFileInfo>_>::optional
            ((optional<std::pair<int,_QFileInfo>_> *)0x221eb5);
  QFileSystemComboBoxPrivate::setRootPath(this_00,in_RSI,lv);
  std::optional<std::pair<int,_QFileInfo>_>::~optional
            ((optional<std::pair<int,_QFileInfo>_> *)0x221ed5);
  return;
}

Assistant:

void QFileSystemComboBox::setRootPath(const QString &rootPath) {
    d->setRootPath(rootPath, {});
}